

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  fpclass_type fVar8;
  int32_t iVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int32_t iVar24;
  fpclass_type fVar25;
  int32_t iVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar31;
  long lVar32;
  fpclass_type *pfVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  type t;
  cpp_dec_float<50U,_int,_void> local_378;
  long local_340;
  IdxElement local_338;
  IdxElement local_2fc;
  IdxElement local_2c0;
  IdxElement local_284;
  IdxElement local_248;
  IdxElement local_20c;
  cpp_dec_float<50U,_int,_void> local_1d0;
  IdxElement local_198;
  IdxElement local_15c;
  IdxElement local_120;
  IdxElement local_e4;
  IdxElement local_a8;
  IdxElement local_6c;
  
  if (start + 1 < end) {
    uVar36 = end - 1;
    uVar27 = uVar36 - start;
    if (0x18 < (int)uVar27) {
LAB_002bdb83:
      iVar28 = (uVar27 >> 1) + start;
      pIVar1 = keys + iVar28;
      pIVar2 = keys + iVar28;
      pnVar31 = &pIVar2->val;
      iVar28 = pIVar2->idx;
      uVar11 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
      uVar13 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
      uVar14 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
      uVar15 = *(undefined8 *)(pnVar31->m_backend).data._M_elems;
      uVar16 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
      iVar7 = (pIVar2->val).m_backend.exp;
      bVar5 = (pIVar2->val).m_backend.neg;
      fVar8 = (pIVar2->val).m_backend.fpclass;
      iVar9 = (pIVar2->val).m_backend.prec_elem;
      lVar30 = (long)start;
      local_340 = -(long)(int)uVar36;
      uVar27 = uVar36;
      uVar35 = start;
      do {
        uVar34 = (ulong)uVar27;
        if ((type & 1U) == 0) {
          if ((int)uVar35 < (int)uVar36) {
            pfVar33 = &keys[(int)uVar35].val.m_backend.fpclass;
            do {
              local_e4.idx = pfVar33[-0xd];
              local_e4.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
              local_e4.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
              local_e4.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
              local_e4.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
              local_e4.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
              local_e4.val.m_backend.exp = pfVar33[-2];
              local_e4.val.m_backend.neg = *(bool *)(pfVar33 + -1);
              local_e4.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
              local_284.idx = iVar28;
              local_284.val.m_backend.data._M_elems._0_8_ = uVar15;
              local_284.val.m_backend.data._M_elems._8_8_ = uVar16;
              local_284.val.m_backend.data._M_elems._16_8_ = uVar13;
              local_284.val.m_backend.data._M_elems._24_8_ = uVar14;
              local_284.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_284.val.m_backend.exp = iVar7;
              local_284.val.m_backend.neg = bVar5;
              local_284.val.m_backend.fpclass = fVar8;
              local_284.val.m_backend.prec_elem = iVar9;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_378,compare,&local_e4,&local_284);
              if (local_378.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1d0,0,(type *)0x0);
              iVar29 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_378,&local_1d0);
              if (0 < iVar29) break;
              uVar35 = uVar35 + 1;
              pfVar33 = pfVar33 + 0xf;
            } while (uVar36 != uVar35);
          }
          if (start < (int)uVar27) {
            uVar34 = (ulong)(int)uVar27;
            pfVar33 = &keys[uVar34].val.m_backend.fpclass;
            do {
              local_120.idx = pfVar33[-0xd];
              local_120.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
              local_120.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
              local_120.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
              local_120.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
              local_120.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
              local_120.val.m_backend.exp = pfVar33[-2];
              local_120.val.m_backend.neg = *(bool *)(pfVar33 + -1);
              local_120.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
              local_2c0.idx = iVar28;
              local_2c0.val.m_backend.data._M_elems._0_8_ = uVar15;
              local_2c0.val.m_backend.data._M_elems._8_8_ = uVar16;
              local_2c0.val.m_backend.data._M_elems._16_8_ = uVar13;
              local_2c0.val.m_backend.data._M_elems._24_8_ = uVar14;
              local_2c0.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_2c0.val.m_backend.exp = iVar7;
              local_2c0.val.m_backend.neg = bVar5;
              local_2c0.val.m_backend.fpclass = fVar8;
              local_2c0.val.m_backend.prec_elem = iVar9;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_378,compare,&local_120,&local_2c0);
              if (local_378.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1d0,0,(type *)0x0);
              iVar29 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_378,&local_1d0);
              if (iVar29 < 1) break;
              uVar34 = uVar34 - 1;
              pfVar33 = pfVar33 + -0xf;
            } while (lVar30 < (long)uVar34);
          }
        }
        else {
          if ((int)uVar35 < (int)uVar36) {
            pfVar33 = &keys[(int)uVar35].val.m_backend.fpclass;
            lVar32 = (int)uVar35 + local_340;
            lVar38 = 0;
            do {
              local_6c.idx = pfVar33[-0xd];
              local_6c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
              local_6c.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
              local_6c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
              local_6c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
              local_6c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
              local_6c.val.m_backend.exp = pfVar33[-2];
              local_6c.val.m_backend.neg = *(bool *)(pfVar33 + -1);
              local_6c.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
              local_20c.idx = iVar28;
              local_20c.val.m_backend.data._M_elems._0_8_ = uVar15;
              local_20c.val.m_backend.data._M_elems._8_8_ = uVar16;
              local_20c.val.m_backend.data._M_elems._16_8_ = uVar13;
              local_20c.val.m_backend.data._M_elems._24_8_ = uVar14;
              local_20c.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_20c.val.m_backend.exp = iVar7;
              local_20c.val.m_backend.neg = bVar5;
              local_20c.val.m_backend.fpclass = fVar8;
              local_20c.val.m_backend.prec_elem = iVar9;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_378,compare,&local_6c,&local_20c);
              if (local_378.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1d0,0,(type *)0x0);
              iVar29 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_378,&local_1d0);
              if (-1 < iVar29) {
                uVar35 = uVar35 - (int)lVar38;
                goto LAB_002bdedc;
              }
              lVar38 = lVar38 + -1;
              pfVar33 = pfVar33 + 0xf;
            } while (lVar32 != lVar38);
            uVar35 = uVar35 - (int)lVar38;
          }
LAB_002bdedc:
          if (start < (int)uVar27) {
            uVar34 = (ulong)(int)uVar27;
            pfVar33 = &keys[uVar34].val.m_backend.fpclass;
            do {
              local_a8.idx = pfVar33[-0xd];
              local_a8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
              local_a8.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
              local_a8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
              local_a8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
              local_a8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
              local_a8.val.m_backend.exp = pfVar33[-2];
              local_a8.val.m_backend.neg = *(bool *)(pfVar33 + -1);
              local_a8.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
              local_248.idx = iVar28;
              local_248.val.m_backend.data._M_elems._0_8_ = uVar15;
              local_248.val.m_backend.data._M_elems._8_8_ = uVar16;
              local_248.val.m_backend.data._M_elems._16_8_ = uVar13;
              local_248.val.m_backend.data._M_elems._24_8_ = uVar14;
              local_248.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_248.val.m_backend.exp = iVar7;
              local_248.val.m_backend.neg = bVar5;
              local_248.val.m_backend.fpclass = fVar8;
              local_248.val.m_backend.prec_elem = iVar9;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_378,compare,&local_a8,&local_248);
              if (local_378.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1d0,0,(type *)0x0);
              iVar29 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_378,&local_1d0);
              if (iVar29 < 0) break;
              uVar34 = uVar34 - 1;
              pfVar33 = pfVar33 + -0xf;
            } while (lVar30 < (long)uVar34);
          }
        }
        uVar27 = (uint)uVar34;
        if ((int)uVar27 <= (int)uVar35) goto LAB_002be23f;
        iVar29 = keys[(int)uVar35].idx;
        uVar12 = *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 8);
        puVar3 = keys[(int)uVar35].val.m_backend.data._M_elems + 4;
        uVar17 = *(undefined8 *)puVar3;
        uVar18 = *(undefined8 *)(puVar3 + 2);
        uVar19 = *(undefined8 *)keys[(int)uVar35].val.m_backend.data._M_elems;
        uVar20 = *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 2);
        iVar10 = keys[(int)uVar35].val.m_backend.exp;
        bVar6 = keys[(int)uVar35].val.m_backend.neg;
        keys[(int)uVar35].idx = keys[(int)uVar27].idx;
        *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 8) =
             *(undefined8 *)(keys[(int)uVar27].val.m_backend.data._M_elems + 8);
        uVar21 = *(undefined8 *)keys[(int)uVar27].val.m_backend.data._M_elems;
        uVar22 = *(undefined8 *)(keys[(int)uVar27].val.m_backend.data._M_elems + 2);
        puVar3 = keys[(int)uVar27].val.m_backend.data._M_elems + 4;
        uVar23 = *(undefined8 *)(puVar3 + 2);
        puVar4 = keys[(int)uVar35].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar4 = *(undefined8 *)puVar3;
        *(undefined8 *)(puVar4 + 2) = uVar23;
        *(undefined8 *)keys[(int)uVar35].val.m_backend.data._M_elems = uVar21;
        *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 2) = uVar22;
        keys[(int)uVar35].val.m_backend.exp = keys[(int)uVar27].val.m_backend.exp;
        keys[(int)uVar35].val.m_backend.neg = keys[(int)uVar27].val.m_backend.neg;
        keys[(int)uVar27].idx = iVar29;
        *(undefined8 *)keys[(int)uVar27].val.m_backend.data._M_elems = uVar19;
        *(undefined8 *)(keys[(int)uVar27].val.m_backend.data._M_elems + 2) = uVar20;
        puVar3 = keys[(int)uVar27].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar3 = uVar17;
        *(undefined8 *)(puVar3 + 2) = uVar18;
        *(undefined8 *)(keys[(int)uVar27].val.m_backend.data._M_elems + 8) = uVar12;
        keys[(int)uVar27].val.m_backend.exp = iVar10;
        keys[(int)uVar27].val.m_backend.neg = bVar6;
        fVar25 = keys[(int)uVar35].val.m_backend.fpclass;
        iVar26 = keys[(int)uVar35].val.m_backend.prec_elem;
        iVar24 = keys[(int)uVar27].val.m_backend.prec_elem;
        keys[(int)uVar35].val.m_backend.fpclass = keys[(int)uVar27].val.m_backend.fpclass;
        keys[(int)uVar35].val.m_backend.prec_elem = iVar24;
        keys[(int)uVar27].val.m_backend.fpclass = fVar25;
        keys[(int)uVar27].val.m_backend.prec_elem = iVar26;
        uVar35 = uVar35 + 1;
        uVar27 = uVar27 - 1;
      } while( true );
    }
LAB_002be6cb:
    if (0 < (int)uVar27) {
      SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,uVar36,compare,start);
    }
  }
  return;
LAB_002be23f:
  if ((type & 1U) == 0) {
    if (start < (int)uVar27) {
      uVar34 = (ulong)(int)uVar27;
      pfVar33 = &keys[uVar34].val.m_backend.fpclass;
      do {
        local_198.idx = pfVar33[-0xd];
        local_198.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
        local_198.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
        local_198.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
        local_198.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
        local_198.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
        local_198.val.m_backend.exp = pfVar33[-2];
        local_198.val.m_backend.neg = *(bool *)(pfVar33 + -1);
        local_198.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
        local_338.idx = iVar28;
        local_338.val.m_backend.data._M_elems._0_8_ = uVar15;
        local_338.val.m_backend.data._M_elems._8_8_ = uVar16;
        local_338.val.m_backend.data._M_elems._16_8_ = uVar13;
        local_338.val.m_backend.data._M_elems._24_8_ = uVar14;
        local_338.val.m_backend.data._M_elems._32_8_ = uVar11;
        local_338.val.m_backend.exp = iVar7;
        local_338.val.m_backend.neg = bVar5;
        local_338.val.m_backend.fpclass = fVar8;
        local_338.val.m_backend.prec_elem = iVar9;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_378,compare,&local_338,&local_198);
        if (local_378.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_1d0,0,(type *)0x0);
        iVar29 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_378,&local_1d0);
        if (0 < iVar29) break;
        uVar34 = uVar34 - 1;
        pfVar33 = pfVar33 + -0xf;
      } while (lVar30 < (long)uVar34);
    }
    uVar27 = (uint)uVar34;
    if (uVar27 == uVar36) {
      iVar28 = keys[(int)uVar27].idx;
      uVar11 = *(undefined8 *)(keys[(int)uVar27].val.m_backend.data._M_elems + 8);
      puVar3 = keys[(int)uVar27].val.m_backend.data._M_elems + 4;
      uVar13 = *(undefined8 *)puVar3;
      uVar14 = *(undefined8 *)(puVar3 + 2);
      uVar15 = *(undefined8 *)keys[(int)uVar27].val.m_backend.data._M_elems;
      uVar16 = *(undefined8 *)(keys[(int)uVar27].val.m_backend.data._M_elems + 2);
      iVar7 = keys[(int)uVar27].val.m_backend.exp;
      bVar5 = keys[(int)uVar27].val.m_backend.neg;
      keys[(int)uVar27].idx = pIVar1->idx;
      *(undefined8 *)(keys[(int)uVar27].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
      uVar12 = *(undefined8 *)(pnVar31->m_backend).data._M_elems;
      uVar17 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
      uVar18 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
      puVar3 = keys[(int)uVar27].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar3 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar3 + 2) = uVar18;
      *(undefined8 *)keys[(int)uVar27].val.m_backend.data._M_elems = uVar12;
      *(undefined8 *)(keys[(int)uVar27].val.m_backend.data._M_elems + 2) = uVar17;
      keys[(int)uVar27].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[(int)uVar27].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar28;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8) = uVar11;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4) = uVar13;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6) = uVar14;
      *(undefined8 *)(pnVar31->m_backend).data._M_elems = uVar15;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2) = uVar16;
      (pIVar1->val).m_backend.exp = iVar7;
      (pIVar1->val).m_backend.neg = bVar5;
      fVar8 = keys[(int)uVar27].val.m_backend.fpclass;
      iVar24 = keys[(int)uVar27].val.m_backend.prec_elem;
      iVar9 = (pIVar1->val).m_backend.prec_elem;
      keys[(int)uVar27].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[(int)uVar27].val.m_backend.prec_elem = iVar9;
      (pIVar1->val).m_backend.fpclass = fVar8;
      (pIVar1->val).m_backend.prec_elem = iVar24;
      uVar27 = uVar27 - 1;
    }
  }
  else {
    if ((int)uVar35 < (int)uVar36) {
      pfVar33 = &keys[(int)uVar35].val.m_backend.fpclass;
      do {
        local_15c.idx = pfVar33[-0xd];
        local_15c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar33 + -4);
        local_15c.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar33 + -0xc))->data)._M_elems;
        local_15c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar33 + -10);
        local_15c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar33 + -8);
        local_15c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar33 + -6);
        local_15c.val.m_backend.exp = pfVar33[-2];
        local_15c.val.m_backend.neg = *(bool *)(pfVar33 + -1);
        local_15c.val.m_backend._48_8_ = *(undefined8 *)pfVar33;
        local_2fc.idx = iVar28;
        local_2fc.val.m_backend.data._M_elems._0_8_ = uVar15;
        local_2fc.val.m_backend.data._M_elems._8_8_ = uVar16;
        local_2fc.val.m_backend.data._M_elems._16_8_ = uVar13;
        local_2fc.val.m_backend.data._M_elems._24_8_ = uVar14;
        local_2fc.val.m_backend.data._M_elems._32_8_ = uVar11;
        local_2fc.val.m_backend.exp = iVar7;
        local_2fc.val.m_backend.neg = bVar5;
        local_2fc.val.m_backend.fpclass = fVar8;
        local_2fc.val.m_backend.prec_elem = iVar9;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_378,compare,&local_2fc,&local_15c);
        if (local_378.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_1d0,0,(type *)0x0);
        iVar29 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_378,&local_1d0);
        if (iVar29 < 0) break;
        uVar35 = uVar35 + 1;
        pfVar33 = pfVar33 + 0xf;
      } while (uVar36 != uVar35);
    }
    if (uVar35 == start) {
      iVar28 = keys[(int)uVar35].idx;
      uVar11 = *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 8);
      puVar3 = keys[(int)uVar35].val.m_backend.data._M_elems + 4;
      uVar13 = *(undefined8 *)puVar3;
      uVar14 = *(undefined8 *)(puVar3 + 2);
      uVar15 = *(undefined8 *)keys[(int)uVar35].val.m_backend.data._M_elems;
      uVar16 = *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 2);
      iVar7 = keys[(int)uVar35].val.m_backend.exp;
      bVar5 = keys[(int)uVar35].val.m_backend.neg;
      keys[(int)uVar35].idx = pIVar1->idx;
      *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
      uVar12 = *(undefined8 *)(pnVar31->m_backend).data._M_elems;
      uVar17 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
      uVar18 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
      puVar3 = keys[(int)uVar35].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar3 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar3 + 2) = uVar18;
      *(undefined8 *)keys[(int)uVar35].val.m_backend.data._M_elems = uVar12;
      *(undefined8 *)(keys[(int)uVar35].val.m_backend.data._M_elems + 2) = uVar17;
      keys[(int)uVar35].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[(int)uVar35].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar28;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8) = uVar11;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4) = uVar13;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6) = uVar14;
      *(undefined8 *)(pnVar31->m_backend).data._M_elems = uVar15;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2) = uVar16;
      (pIVar1->val).m_backend.exp = iVar7;
      (pIVar1->val).m_backend.neg = bVar5;
      fVar8 = keys[(int)uVar35].val.m_backend.fpclass;
      iVar24 = keys[(int)uVar35].val.m_backend.prec_elem;
      iVar9 = (pIVar1->val).m_backend.prec_elem;
      keys[(int)uVar35].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[(int)uVar35].val.m_backend.prec_elem = iVar9;
      (pIVar1->val).m_backend.fpclass = fVar8;
      (pIVar1->val).m_backend.prec_elem = iVar24;
      uVar35 = uVar35 + 1;
    }
  }
  if ((int)(uVar36 - uVar35) < (int)(uVar27 - start)) {
    bVar5 = (int)uVar36 <= (int)uVar35;
    uVar37 = uVar27;
    uVar27 = uVar36;
    uVar36 = uVar35;
    uVar35 = start;
    if (bVar5) goto LAB_002be6aa;
  }
  else {
    bVar5 = (int)uVar27 <= start;
    uVar37 = uVar36;
    uVar36 = start;
    start = uVar35;
    if (bVar5) goto LAB_002be6aa;
  }
  SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,uVar27 + 1,compare,uVar36,(bool)(~type & 1));
  start = uVar35;
LAB_002be6aa:
  uVar36 = uVar37;
  type = (bool)(type ^ 1);
  uVar27 = uVar36 - start;
  if ((int)uVar27 < 0x19) goto LAB_002be6cb;
  goto LAB_002bdb83;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}